

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O0

void ngx_rbtree_delete(ngx_rbtree_t *tree,ngx_rbtree_node_t *node)

{
  u_char uVar1;
  ngx_rbtree_node_t *sentinel_00;
  bool bVar2;
  ngx_rbtree_node_t *local_48;
  ngx_rbtree_node_t *w;
  ngx_rbtree_node_t *temp;
  ngx_rbtree_node_t *subst;
  ngx_rbtree_node_t *sentinel;
  ngx_rbtree_node_t **root;
  ngx_uint_t red;
  ngx_rbtree_node_t *node_local;
  ngx_rbtree_t *tree_local;
  
  sentinel_00 = tree->sentinel;
  temp = node;
  if (node->left == sentinel_00) {
    w = node->right;
  }
  else if (node->right == sentinel_00) {
    w = node->left;
  }
  else {
    temp = ngx_rbtree_min(node->right,sentinel_00);
    if (temp->left == sentinel_00) {
      w = temp->right;
    }
    else {
      w = temp->left;
    }
  }
  if (temp == tree->root) {
    tree->root = w;
    w->color = '\0';
    node->left = (ngx_rbtree_node_t *)0x0;
    node->right = (ngx_rbtree_node_t *)0x0;
    node->parent = (ngx_rbtree_node_t *)0x0;
    node->key = 0;
  }
  else {
    uVar1 = temp->color;
    if (temp == temp->parent->left) {
      temp->parent->left = w;
    }
    else {
      temp->parent->right = w;
    }
    if (temp == node) {
      w->parent = temp->parent;
    }
    else {
      if (temp->parent == node) {
        w->parent = temp;
      }
      else {
        w->parent = temp->parent;
      }
      temp->left = node->left;
      temp->right = node->right;
      temp->parent = node->parent;
      temp->color = node->color;
      if (node == tree->root) {
        tree->root = temp;
      }
      else if (node == node->parent->left) {
        node->parent->left = temp;
      }
      else {
        node->parent->right = temp;
      }
      if (temp->left != sentinel_00) {
        temp->left->parent = temp;
      }
      if (temp->right != sentinel_00) {
        temp->right->parent = temp;
      }
    }
    node->left = (ngx_rbtree_node_t *)0x0;
    node->right = (ngx_rbtree_node_t *)0x0;
    node->parent = (ngx_rbtree_node_t *)0x0;
    node->key = 0;
    if (uVar1 == '\0') {
      while( true ) {
        bVar2 = false;
        if (w != tree->root) {
          bVar2 = w->color == '\0';
        }
        if (!bVar2) break;
        if (w == w->parent->left) {
          local_48 = w->parent->right;
          if (local_48->color != '\0') {
            local_48->color = '\0';
            w->parent->color = '\x01';
            ngx_rbtree_left_rotate(&tree->root,sentinel_00,w->parent);
            local_48 = w->parent->right;
          }
          if ((local_48->left->color == '\0') && (local_48->right->color == '\0')) {
            local_48->color = '\x01';
            w = w->parent;
          }
          else {
            if (local_48->right->color == '\0') {
              local_48->left->color = '\0';
              local_48->color = '\x01';
              ngx_rbtree_right_rotate(&tree->root,sentinel_00,local_48);
              local_48 = w->parent->right;
            }
            local_48->color = w->parent->color;
            w->parent->color = '\0';
            local_48->right->color = '\0';
            ngx_rbtree_left_rotate(&tree->root,sentinel_00,w->parent);
            w = tree->root;
          }
        }
        else {
          local_48 = w->parent->left;
          if (local_48->color != '\0') {
            local_48->color = '\0';
            w->parent->color = '\x01';
            ngx_rbtree_right_rotate(&tree->root,sentinel_00,w->parent);
            local_48 = w->parent->left;
          }
          if ((local_48->left->color == '\0') && (local_48->right->color == '\0')) {
            local_48->color = '\x01';
            w = w->parent;
          }
          else {
            if (local_48->left->color == '\0') {
              local_48->right->color = '\0';
              local_48->color = '\x01';
              ngx_rbtree_left_rotate(&tree->root,sentinel_00,local_48);
              local_48 = w->parent->left;
            }
            local_48->color = w->parent->color;
            w->parent->color = '\0';
            local_48->left->color = '\0';
            ngx_rbtree_right_rotate(&tree->root,sentinel_00,w->parent);
            w = tree->root;
          }
        }
      }
      w->color = '\0';
    }
  }
  return;
}

Assistant:

void
ngx_rbtree_delete(ngx_rbtree_t *tree, ngx_rbtree_node_t *node)
{
    ngx_uint_t           red;
    ngx_rbtree_node_t  **root, *sentinel, *subst, *temp, *w;

    /* a binary tree delete */

    root = &tree->root;
    sentinel = tree->sentinel;

    if (node->left == sentinel) {
        temp = node->right;
        subst = node;

    } else if (node->right == sentinel) {
        temp = node->left;
        subst = node;

    } else {
        subst = ngx_rbtree_min(node->right, sentinel);

        if (subst->left != sentinel) {
            temp = subst->left;
        } else {
            temp = subst->right;
        }
    }

    if (subst == *root) {
        *root = temp;
        ngx_rbt_black(temp);

        /* DEBUG stuff */
        node->left = NULL;
        node->right = NULL;
        node->parent = NULL;
        node->key = 0;

        return;
    }

    red = ngx_rbt_is_red(subst);

    if (subst == subst->parent->left) {
        subst->parent->left = temp;

    } else {
        subst->parent->right = temp;
    }

    if (subst == node) {

        temp->parent = subst->parent;

    } else {

        if (subst->parent == node) {
            temp->parent = subst;

        } else {
            temp->parent = subst->parent;
        }

        subst->left = node->left;
        subst->right = node->right;
        subst->parent = node->parent;
        ngx_rbt_copy_color(subst, node);

        if (node == *root) {
            *root = subst;

        } else {
            if (node == node->parent->left) {
                node->parent->left = subst;
            } else {
                node->parent->right = subst;
            }
        }

        if (subst->left != sentinel) {
            subst->left->parent = subst;
        }

        if (subst->right != sentinel) {
            subst->right->parent = subst;
        }
    }

    /* DEBUG stuff */
    node->left = NULL;
    node->right = NULL;
    node->parent = NULL;
    node->key = 0;

    if (red) {
        return;
    }

    /* a delete fixup */

    while (temp != *root && ngx_rbt_is_black(temp)) {

        if (temp == temp->parent->left) {
            w = temp->parent->right;

            if (ngx_rbt_is_red(w)) {
                ngx_rbt_black(w);
                ngx_rbt_red(temp->parent);
                ngx_rbtree_left_rotate(root, sentinel, temp->parent);
                w = temp->parent->right;
            }

            if (ngx_rbt_is_black(w->left) && ngx_rbt_is_black(w->right)) {
                ngx_rbt_red(w);
                temp = temp->parent;

            } else {
                if (ngx_rbt_is_black(w->right)) {
                    ngx_rbt_black(w->left);
                    ngx_rbt_red(w);
                    ngx_rbtree_right_rotate(root, sentinel, w);
                    w = temp->parent->right;
                }

                ngx_rbt_copy_color(w, temp->parent);
                ngx_rbt_black(temp->parent);
                ngx_rbt_black(w->right);
                ngx_rbtree_left_rotate(root, sentinel, temp->parent);
                temp = *root;
            }

        } else {
            w = temp->parent->left;

            if (ngx_rbt_is_red(w)) {
                ngx_rbt_black(w);
                ngx_rbt_red(temp->parent);
                ngx_rbtree_right_rotate(root, sentinel, temp->parent);
                w = temp->parent->left;
            }

            if (ngx_rbt_is_black(w->left) && ngx_rbt_is_black(w->right)) {
                ngx_rbt_red(w);
                temp = temp->parent;

            } else {
                if (ngx_rbt_is_black(w->left)) {
                    ngx_rbt_black(w->right);
                    ngx_rbt_red(w);
                    ngx_rbtree_left_rotate(root, sentinel, w);
                    w = temp->parent->left;
                }

                ngx_rbt_copy_color(w, temp->parent);
                ngx_rbt_black(temp->parent);
                ngx_rbt_black(w->left);
                ngx_rbtree_right_rotate(root, sentinel, temp->parent);
                temp = *root;
            }
        }
    }

    ngx_rbt_black(temp);
}